

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int call_setter(JSContext *ctx,JSObject *setter,JSValue this_obj,JSValue val,int flags)

{
  int iVar1;
  BOOL BVar2;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  JSValue JVar3;
  JSValue JVar4;
  uint in_stack_00000008;
  JSValue func;
  JSValue ret;
  JSContext *in_stack_ffffffffffffff60;
  JSValue in_stack_ffffffffffffff68;
  int64_t iVar5;
  int local_4;
  
  if (in_RSI.ptr == (void *)0x0) {
    JS_FreeValue(in_stack_ffffffffffffff60,in_stack_ffffffffffffff68);
    if (((in_stack_00000008 & 0x4000) == 0) &&
       (((in_stack_00000008 & 0x8000) == 0 || (BVar2 = is_strict_mode(in_RDI), BVar2 == 0)))) {
      local_4 = 0;
    }
    else {
      JS_ThrowTypeError(in_RDI,"no setter for property");
      local_4 = -1;
    }
    return local_4;
  }
  iVar5 = -1;
  JVar3.tag = -1;
  JVar3.u.ptr = in_RSI.ptr;
  JVar3 = JS_DupValue(in_RDI,JVar3);
  JVar4.tag = iVar5;
  JVar4.u.ptr = in_RSI.ptr;
  JVar4 = JS_CallFree((JSContext *)JVar3.tag,JVar3,JVar4,JVar3.u._4_4_,(JSValue *)in_RDI);
  JS_FreeValue(in_stack_ffffffffffffff60,in_stack_ffffffffffffff68);
  iVar1 = JS_IsException(JVar4);
  if (iVar1 != 0) {
    return -1;
  }
  JS_FreeValue(in_stack_ffffffffffffff60,in_stack_ffffffffffffff68);
  return 1;
}

Assistant:

static int call_setter(JSContext *ctx, JSObject *setter,
                       JSValueConst this_obj, JSValue val, int flags)
{
    JSValue ret, func;
    if (likely(setter)) {
        func = JS_MKPTR(JS_TAG_OBJECT, setter);
        /* Note: the field could be removed in the setter */
        func = JS_DupValue(ctx, func);
        ret = JS_CallFree(ctx, func, this_obj, 1, (JSValueConst *)&val);
        JS_FreeValue(ctx, val);
        if (JS_IsException(ret))
            return -1;
        JS_FreeValue(ctx, ret);
        return TRUE;
    } else {
        JS_FreeValue(ctx, val);
        if ((flags & JS_PROP_THROW) ||
            ((flags & JS_PROP_THROW_STRICT) && is_strict_mode(ctx))) {
            JS_ThrowTypeError(ctx, "no setter for property");
            return -1;
        }
        return FALSE;
    }
}